

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::WATParser::MemType> *
wasm::WATParser::memtype<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::WATParser::MemType> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  Type TVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> expected;
  Type local_38;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  Type local_20;
  Type addressType;
  ParseDeclsCtx *ctx_local;
  
  addressType.id = (uintptr_t)ctx;
  wasm::Type::Type(&local_20,i32);
  TVar1.id = addressType.id;
  local_30 = sv("i64",3);
  bVar2 = Lexer::takeKeyword((Lexer *)TVar1.id,local_30);
  TVar1 = addressType;
  if (bVar2) {
    wasm::Type::Type(&local_38,i64);
    local_20.id = local_38.id;
  }
  else {
    expected = sv("i32",3);
    Lexer::takeKeyword((Lexer *)TVar1.id,expected);
  }
  memtypeContinued<wasm::WATParser::ParseDeclsCtx>
            (__return_storage_ptr__,(ParseDeclsCtx *)addressType.id,local_20);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::MemTypeT> memtype(Ctx& ctx) {
  Type addressType = Type::i32;
  if (ctx.in.takeKeyword("i64"sv)) {
    addressType = Type::i64;
  } else {
    ctx.in.takeKeyword("i32"sv);
  }
  return memtypeContinued(ctx, addressType);
}